

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

int make_user_callback(void *data,int nr_cols,char **field,char **colName)

{
  int iVar1;
  allocator local_a1;
  string username;
  string password;
  string bio;
  string alias;
  
  std::__cxx11::string::string((string *)&username,*field,(allocator *)&alias);
  iVar1 = std::__cxx11::stoi(&username,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&username);
  std::__cxx11::string::string((string *)&username,field[1],(allocator *)&alias);
  alias._M_dataplus._M_p = (pointer)&alias.field_2;
  alias._M_string_length = 0;
  alias.field_2._M_local_buf[0] = '\0';
  if (field[2] != (char *)0x0) {
    std::__cxx11::string::string((string *)&bio,field[2],(allocator *)&password);
    std::__cxx11::string::operator=((string *)&alias,(string *)&bio);
    std::__cxx11::string::~string((string *)&bio);
  }
  bio._M_dataplus._M_p = (pointer)&bio.field_2;
  bio._M_string_length = 0;
  bio.field_2._M_local_buf[0] = '\0';
  if (field[3] != (char *)0x0) {
    std::__cxx11::string::string((string *)&password,field[3],&local_a1);
    std::__cxx11::string::operator=((string *)&bio,(string *)&password);
    std::__cxx11::string::~string((string *)&password);
  }
  std::__cxx11::string::string((string *)&password,field[4],&local_a1);
  *(int *)data = iVar1;
  std::__cxx11::string::_M_assign((string *)((long)data + 8));
  std::__cxx11::string::_M_assign((string *)((long)data + 0x28));
  std::__cxx11::string::_M_assign((string *)((long)data + 0x48));
  std::__cxx11::string::_M_assign((string *)((long)data + 0x68));
  std::__cxx11::string::~string((string *)&password);
  std::__cxx11::string::~string((string *)&bio);
  std::__cxx11::string::~string((string *)&alias);
  std::__cxx11::string::~string((string *)&username);
  return 0;
}

Assistant:

static int make_user_callback(void *data, int nr_cols, char **field, char **colName)
{
	User* result = static_cast<User*>(data);
	try
	{
		int id = std::stoi(field[0]);
		std::string username(field[1]);
		std::string alias;
		if (field[2] != nullptr)
			alias = std::string(field[2]);
		std::string bio;
		if (field[3] != nullptr)
			bio = std::string(field[3]);
		std::string password(field[4]);

		result->setId(id);
		result->setUsername(username);
		result->setAlias(alias);
		result->setBio(bio);
		result->setPassword(password);
	}
	catch (...)
	{
		return 1;
	}

	return 0;
}